

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int spng_set_plte(spng_ctx *ctx,spng_plte *plte)

{
  spng_chunk_bitfield sVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = 1;
  iVar3 = iVar5;
  if (plte != (spng_plte *)0x0 && ctx != (spng_ctx *)0x0) {
    if ((ctx->data == (uchar *)0x0) && ((ctx->field_0xcc & 0x10) == 0)) {
      iVar3 = 0x52;
    }
    else {
      iVar3 = read_chunks(ctx,0);
      if (((iVar3 == 0) && (sVar1 = ctx->stored, iVar3 = iVar5, ((uint)sVar1 & 1) != 0)) &&
         (iVar4 = check_plte(plte,&ctx->ihdr), iVar4 == 0)) {
        uVar2 = plte->n_entries;
        (ctx->plte).n_entries = uVar2;
        memcpy((ctx->plte).entries,plte->entries,(ulong)uVar2 << 2);
        ctx->stored = (spng_chunk_bitfield)((uint)sVar1 | 2);
        *(byte *)&ctx->user = *(byte *)&ctx->user | 2;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int spng_set_plte(spng_ctx *ctx, struct spng_plte *plte)
{
    SPNG_SET_CHUNK_BOILERPLATE(plte);

    if(!ctx->stored.ihdr) return 1;

    if(check_plte(plte, &ctx->ihdr)) return 1;

    ctx->plte.n_entries = plte->n_entries;

    memcpy(ctx->plte.entries, plte->entries, plte->n_entries * sizeof(struct spng_plte_entry));

    ctx->stored.plte = 1;
    ctx->user.plte = 1;

    return 0;
}